

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

bool __thiscall soul::AST::BinaryOperator::isResolved(BinaryOperator *this)

{
  Expression *pEVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  char local_28 [16];
  Structure *local_18;
  
  pEVar1 = (this->lhs).object;
  if (pEVar1->kind == value) {
    iVar3 = (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[3])();
    if (((char)iVar3 != '\0') && (pEVar1 = (this->rhs).object, pEVar1->kind == value)) {
      iVar3 = (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[3])();
      if ((char)iVar3 != '\0') {
        (*(this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[4])
                  (local_28,this);
        bVar4 = local_28[0] != '\0';
        bVar2 = true;
        goto LAB_001fc8ca;
      }
    }
  }
  bVar2 = false;
  bVar4 = false;
LAB_001fc8ca:
  if (bVar2) {
    RefCountedPtr<soul::Structure>::decIfNotNull(local_18);
  }
  return bVar4;
}

Assistant:

bool isResolved() const override            { return isResolvedAsValue (lhs.get()) && isResolvedAsValue (rhs.get()) && getResultType().isValid(); }